

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

bool __thiscall
cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=(iterator *this,iterator other)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  iterator *this_local;
  iterator other_local;
  
  if (this->Tree == (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0x70,
                  "bool cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=(iterator) const [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->Tree->UpPositions)
  ;
  sVar3 = std::
          vector<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
          ::size(&this->Tree->Data);
  if (sVar2 == sVar3) {
    bVar1 = operator==(this,other);
    return (bool)((bVar1 ^ 0xffU) & 1);
  }
  __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                ,0x71,
                "bool cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=(iterator) const [T = cmStateDetail::PolicyStackEntry]"
               );
}

Assistant:

bool operator!=(iterator other) const
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      return !(*this == other);
    }